

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

shared_ptr<embree::Texture> __thiscall
embree::XMLLoader::loadTextureParm(XMLLoader *this,Ref<embree::XML> *xml)

{
  pointer pcVar1;
  XML *pXVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_type sVar4;
  undefined8 uVar5;
  int iVar6;
  Format format;
  uint uVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  int *piVar10;
  long lVar11;
  FileName *pFVar12;
  Texture *pTVar13;
  ulong uVar14;
  runtime_error *prVar15;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Texture *__tmp;
  FileName *pFVar17;
  uint uVar18;
  shared_ptr<embree::Texture> sVar19;
  FileName src;
  string id;
  undefined1 local_d8 [40];
  undefined1 local_b0 [16];
  undefined1 local_a0 [28];
  Format local_84;
  string local_80;
  long local_60;
  string local_58;
  _Alloc_hider local_38;
  
  pXVar2 = (XML *)*in_RDX;
  local_80._M_dataplus._M_p = local_a0 + 0x30;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x20),"id","");
  XML::parm(&local_58,pXVar2,(string *)(local_a0 + 0x20));
  if (local_80._M_dataplus._M_p != local_a0 + 0x30) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  iVar6 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar6 != 0) {
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                    *)&((xml[10].ptr)->children).
                       super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
    if (iVar8._M_node != (_Base_ptr)&(xml[10].ptr)->body) {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                             *)&((xml[10].ptr)->children).
                                super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_58);
      (this->path).filename._M_dataplus._M_p =
           (pointer)(pmVar9->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var3 = (pmVar9->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      (this->path).filename._M_string_length = (size_type)p_Var3;
      _Var16._M_pi = extraout_RDX;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      goto LAB_00178f75;
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  (this->path).filename._M_string_length = 0;
  pXVar2 = (XML *)*in_RDX;
  local_d8._0_8_ = (Texture *)(local_d8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"src","");
  XML::parm((string *)local_b0,pXVar2,(string *)local_d8);
  FileName::FileName((FileName *)(local_a0 + 0x20),(string *)local_b0);
  if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  if ((Texture *)local_d8._0_8_ != (Texture *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_b0._0_8_ = (Texture *)local_a0;
  local_a0._16_8_ = xml;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  iVar6 = std::__cxx11::string::compare(local_b0);
  if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
    operator_delete((void *)local_b0._0_8_);
  }
  if (iVar6 != 0) {
    FileName::operator+((FileName *)local_b0,(FileName *)local_a0._16_8_,
                        (FileName *)(local_a0 + 0x20));
    Texture::load((Texture *)local_d8,(FileName *)local_b0);
    uVar5 = local_d8._8_8_;
    pTVar13 = (Texture *)local_d8._0_8_;
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = 0;
    (this->path).filename._M_dataplus._M_p = (pointer)pTVar13;
    (this->path).filename._M_string_length = uVar5;
    if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
      operator_delete((void *)local_b0._0_8_);
    }
LAB_00178f20:
    iVar6 = std::__cxx11::string::compare((char *)&local_58);
    _Var16._M_pi = extraout_RDX_00;
    if (iVar6 != 0) {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                             *)((((FileName *)(local_a0._16_8_ + 0x40))->filename).field_2.
                                _M_allocated_capacity + 0x90),&local_58);
      (pmVar9->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pTVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar9->super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(this->path).filename._M_string_length);
      _Var16._M_pi = extraout_RDX_01;
    }
    if (local_80._M_dataplus._M_p != local_a0 + 0x30) {
      operator_delete(local_80._M_dataplus._M_p);
      _Var16._M_pi = extraout_RDX_02;
    }
LAB_00178f75:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      _Var16._M_pi = extraout_RDX_03;
    }
    sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var16._M_pi;
    sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<embree::Texture>)
           sVar19.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
  }
  pXVar2 = (XML *)*in_RDX;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"width","");
  XML::parm((string *)local_b0,pXVar2,(string *)local_d8);
  uVar5 = local_b0._0_8_;
  piVar10 = __errno_location();
  iVar6 = *piVar10;
  *piVar10 = 0;
  lVar11 = strtol((char *)uVar5,&local_38._M_p,10);
  if (local_38._M_p == (pointer)uVar5) {
    std::__throw_invalid_argument("stoi");
LAB_00178fb2:
    std::__throw_out_of_range("stoi");
LAB_00178fbe:
    pFVar17 = (FileName *)&local_38;
    std::__throw_invalid_argument("stoi");
  }
  else {
    if (((int)lVar11 != lVar11) || (*piVar10 == 0x22)) goto LAB_00178fb2;
    if (*piVar10 == 0) {
      *piVar10 = iVar6;
    }
    if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
      operator_delete((void *)local_b0._0_8_);
    }
    local_60 = lVar11;
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_);
    }
    pXVar2 = (XML *)*in_RDX;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"height","");
    XML::parm((string *)local_b0,pXVar2,(string *)local_d8);
    uVar5 = local_b0._0_8_;
    iVar6 = *piVar10;
    *piVar10 = 0;
    pFVar12 = (FileName *)strtol((char *)local_b0._0_8_,(char **)&local_38,10);
    if (local_38._M_p == (pointer)uVar5) goto LAB_00178fbe;
    pFVar17 = (FileName *)&local_38;
    if (((FileName *)0xfffffffeffffffff < pFVar12 + -0x4000000) &&
       (pFVar17 = pFVar12, *piVar10 != 0x22)) {
      pcVar1 = local_d8 + 0x10;
      if (*piVar10 == 0) {
        *piVar10 = iVar6;
      }
      if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
        operator_delete((void *)local_b0._0_8_);
      }
      if ((pointer)local_d8._0_8_ != pcVar1) {
        operator_delete((void *)local_d8._0_8_);
      }
      pXVar2 = (XML *)*in_RDX;
      local_d8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"format","");
      XML::parm((string *)local_b0,pXVar2,(string *)local_d8);
      format = Texture::string_to_format((string *)local_b0);
      if ((Texture *)local_b0._0_8_ != (Texture *)local_a0) {
        operator_delete((void *)local_b0._0_8_);
      }
      if ((pointer)local_d8._0_8_ != pcVar1) {
        operator_delete((void *)local_d8._0_8_);
      }
      local_84 = format;
      uVar7 = Texture::getFormatBytesPerTexel(format);
      pFVar17 = (FileName *)local_a0._16_8_;
      lVar11 = ftell((FILE *)(((FileName *)(local_a0._16_8_ + 0x20))->filename)._M_dataplus._M_p);
      uVar18 = (uint)pFVar12 * (int)local_60;
      if ((long)(ulong)(uint)pFVar17[2].filename._M_string_length <
          (long)((ulong)(uVar7 * uVar18) + lVar11)) goto LAB_00178fd6;
      pTVar13 = (Texture *)alignedUSMMalloc(0x40,0x10,DEVICE_READ_ONLY);
      Texture::Texture(pTVar13,(uint)local_60,(uint)pFVar12,local_84,(char *)0x0);
      local_b0._0_8_ = pTVar13;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<embree::Texture*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8),pTVar13);
      pTVar13 = (Texture *)local_b0._0_8_;
      (this->path).filename._M_dataplus._M_p = (pointer)local_b0._0_8_;
      (this->path).filename._M_string_length = local_b0._8_8_;
      uVar14 = __fread_chk(*(void **)(local_b0._0_8_ + 0x18),0xffffffffffffffff,uVar7,(ulong)uVar18,
                           (((FileName *)(local_a0._16_8_ + 0x20))->filename)._M_dataplus._M_p);
      if (uVar14 != uVar18) {
        prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_d8._0_8_ = local_d8 + 0x10;
        sVar4 = (((FileName *)(local_a0._16_8_ + 0x20))->filename)._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,sVar4,
                   (((FileName *)(local_a0._16_8_ + 0x20))->filename).field_2._M_allocated_capacity
                   + sVar4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,"error reading from binary file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
        std::runtime_error::runtime_error(prVar15,(string *)local_b0);
        __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00178f20;
    }
  }
  std::__throw_out_of_range("stoi");
LAB_00178fd6:
  prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d8._0_8_ = local_d8 + 0x10;
  sVar4 = pFVar17[1].filename._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,sVar4,pFVar17[1].filename.field_2._M_allocated_capacity + sVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "error reading from binary file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  std::runtime_error::runtime_error(prVar15,(string *)local_b0);
  __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Texture> XMLLoader::loadTextureParm(const Ref<XML>& xml)
  {
    const std::string id = xml->parm("id");
    if (id != "" && state.textureMap.find(id) != state.textureMap.end())
      return state.textureMap[id];

    std::shared_ptr<Texture> texture;
    const FileName src = xml->parm("src");

    /*! load texture from file */
    if (src.str() != "") {
      texture = Texture::load(path+src);
    }

    /*! load texture from binary file */
    else {
      const unsigned width  = stoi(xml->parm("width"));
      const unsigned height = stoi(xml->parm("height"));
      const Texture::Format format = Texture::string_to_format(xml->parm("format"));
      const unsigned bytesPerTexel = Texture::getFormatBytesPerTexel(format);
      if (ftell(binFile) + width*height*bytesPerTexel > (unsigned)binFileSize)
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
      
      //texture = std::make_shared<Texture>(width,height,format);
      texture = std::shared_ptr<Texture>(new Texture(width,height,format));
      if (width*height != fread(texture->data, bytesPerTexel, width*height, binFile)) 
        THROW_RUNTIME_ERROR("error reading from binary file: "+binFileName.str());
    }
    
    if (id != "") state.textureMap[id] = texture;
    return texture;
  }